

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

void __thiscall CFG::CFG(CFG *this,Addr addr,unsigned_long_long execs)

{
  allocator local_21;
  unsigned_long_long local_20;
  unsigned_long_long execs_local;
  Addr addr_local;
  CFG *this_local;
  
  this->_vptr_CFG = (_func_int **)&PTR__CFG_001718f8;
  this->m_addr = addr;
  this->m_status = UNCHECKED;
  local_20 = execs;
  execs_local = addr;
  addr_local = (Addr)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_functionName,"unknown",&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  this->m_complete = false;
  this->m_execs = local_20;
  this->m_entryNode = (CfgNode *)0x0;
  this->m_exitNode = (CfgNode *)0x0;
  this->m_haltNode = (CfgNode *)0x0;
  std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::set(&this->m_nodes);
  std::
  map<unsigned_long,_CfgNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgNode_*>_>_>
  ::map(&this->m_nodesMap);
  std::set<CfgEdge_*,_std::less<CfgEdge_*>,_std::allocator<CfgEdge_*>_>::set(&this->m_edges);
  std::
  map<CfgNode_*,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>,_std::less<CfgNode_*>,_std::allocator<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>_>
  ::map(&this->m_succs);
  std::
  map<CfgNode_*,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>,_std::less<CfgNode_*>,_std::allocator<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>_>
  ::map(&this->m_preds);
  return;
}

Assistant:

CFG::CFG(Addr addr, unsigned long long execs) : m_addr(addr), m_status(CFG::UNCHECKED),
		m_functionName("unknown"), m_complete(false),
		m_entryNode(0), m_exitNode(0), m_haltNode(0), m_execs(execs) {
}